

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcm.c
# Opt level: O3

void mcmgarb(mcmcx1def *ctx)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  mcmodef *pmVar4;
  uint uVar5;
  ushort *__dest;
  mcmodef **ppmVar6;
  byte bVar7;
  ulong uVar8;
  ushort *p;
  ushort *puVar9;
  ulong uVar10;
  mcmhdef *pmVar11;
  mcmon objnum;
  
  pmVar11 = ctx->mcmcxhpch;
  if (pmVar11 != (mcmhdef *)0x0) {
    do {
      __dest = (ushort *)mcmffh(ctx,(uchar *)(pmVar11 + 1));
      if (__dest != (ushort *)0x0) {
        do {
          ppmVar6 = ctx->mcmcxtab;
          puVar9 = (ushort *)
                   ((long)__dest + (ulong)ppmVar6[*__dest >> 8][(byte)*__dest].mcmosiz + 8);
LAB_00214b24:
          uVar1 = *__dest;
          uVar8 = (ulong)uVar1;
          p = __dest;
          do {
            uVar10 = (ulong)*(ushort *)
                             ((long)&ppmVar6[uVar8 >> 8]->mcmosiz +
                             (ulong)(((uint)uVar8 & 0xff) << 5));
            uVar2 = *(ushort *)((long)p + uVar10 + 8);
            uVar8 = (ulong)uVar2;
            if (uVar8 == 0xffff) goto LAB_00214cc1;
            p = (ushort *)((long)p + uVar10 + 8);
            if ((ppmVar6[uVar2 >> 8][(byte)uVar2].mcmoflg & 4) != 0) goto LAB_00214b81;
          } while (-1 < (char)ppmVar6[uVar2 >> 8][(byte)uVar2].mcmoflg);
          if (p == puVar9) {
            uVar5 = uVar1 & 0xff;
          }
          else {
            uVar5 = uVar1 & 0xff;
            uVar2 = *(ushort *)((long)&ppmVar6[uVar1 >> 8]->mcmosiz + (ulong)(uVar5 << 5));
            uVar8 = (ulong)(uVar2 + 8 & 0xffff);
            puVar9 = (ushort *)((long)p - uVar8);
            *(ushort **)((long)&ppmVar6[uVar1 >> 8]->mcmoptr + (ulong)(uVar5 << 5)) = puVar9 + 4;
            memmove(__dest,(void *)(uVar8 + (long)__dest),(long)p - ((ulong)uVar2 + (long)__dest));
            if (puVar9 != __dest) {
              ppmVar6 = ctx->mcmcxtab;
              do {
                *(ushort **)((long)&ppmVar6[*__dest >> 8]->mcmoptr + (ulong)((*__dest & 0xff) << 5))
                     = __dest + 4;
                ppmVar6 = ctx->mcmcxtab;
                __dest = (ushort *)
                         ((long)__dest +
                         (ulong)*(ushort *)
                                 ((long)&ppmVar6[*__dest >> 8]->mcmosiz +
                                 (ulong)((*__dest & 0xff) << 5)) + 8);
              } while (__dest != puVar9);
            }
            *puVar9 = uVar1;
            ppmVar6 = ctx->mcmcxtab;
            __dest = puVar9;
          }
          uVar2 = *(ushort *)((long)&ppmVar6[uVar1 >> 8]->mcmosiz + (ulong)(uVar5 << 5));
          uVar8 = (ulong)uVar2;
          uVar3 = *(ushort *)((long)__dest + uVar8 + 8);
          bVar7 = (byte)uVar3;
          pmVar4 = ppmVar6[uVar3 >> 8];
          *(ushort *)((long)&ppmVar6[uVar1 >> 8]->mcmosiz + (ulong)(uVar5 << 5)) =
               pmVar4[bVar7].mcmosiz + uVar2 + 8;
          mcmunl(ctx,*(mcmon *)((long)__dest + uVar8 + 8),&ctx->mcmcxfre);
          pmVar4[bVar7].mcmonxt = ctx->mcmcxunu;
          ctx->mcmcxunu = *(mcmon *)((long)__dest + uVar8 + 8);
          pmVar4[bVar7].mcmoflg = 0;
        } while( true );
      }
LAB_00214cc1:
      pmVar11 = pmVar11->mcmhnxt;
    } while (pmVar11 != (mcmhdef *)0x0);
  }
  return;
LAB_00214b81:
  __dest = (ushort *)mcmffh(ctx,(uchar *)p);
  if (__dest == (ushort *)0x0) goto LAB_00214cc1;
  goto LAB_00214b24;
}

Assistant:

static void mcmgarb(mcmcx1def *ctx)
{
    mcmhdef *h;
    uchar   *p;
    uchar   *q;
    uchar   *nxt;
    ushort   flags;
    
    MCMGLBCTX(ctx);

    for (h = ctx->mcmcxhpch ; h ; h = h->mcmhnxt)
    {
        p = (uchar *)(h+1);                   /* get pointer to actual heap */
        p = mcmffh(ctx, p);                 /* get first free block in heap */
        if (!p) continue;             /* can't do anything - no free blocks */
        nxt = mcmnxh(ctx, p);              /* remember immediate next block */
        
        for (q=p ;; )
        {
            q = mcmnxh(ctx, q);                  /* find next chunk in heap */
            if (*(mcmon *)q == MCMONINV) break;      /* reached end of heap */
            assert(mcmgobje(ctx, *(mcmon *)q)->mcmoptr
                   == q + osrndsz(sizeof(mcmon)));
            flags = mcmgobje(ctx, *(mcmon *)q)->mcmoflg;       /* get flags */

            /* if the block is locked, p can't be relocated */
            if (flags & MCMOFLOCK)
            {
                p = mcmffh(ctx, q);         /* find next free block after p */
                q = p;
                if (p) continue;   /* try again; start with next free block */
                else break;         /* no more free blocks - done with heap */
            }

            /* if the block is free, we can relocate between p and q */
            if (flags & MCMOFFREE)
            {
                if (q != nxt) p = mcmreloc(ctx, p, q);          /* relocate */
                mcmconsol(ctx, p);           /* consolidate two free blocks */
                
                /* resume looking, starting with consolidated block */
                nxt = mcmnxh(ctx, p);
                q = p;
                continue;
            }
        }
    }
}